

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perceptron.hpp
# Opt level: O3

void __thiscall Preceptron_SIGMOID::Backward(Preceptron_SIGMOID *this)

{
  pointer pdVar1;
  pointer pdVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  double extraout_XMM0_Qa;
  double dVar6;
  double dVar7;
  
  if ((this->super_Preceptron).weight.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (this->super_Preceptron).weight.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start) {
    pdVar2 = (this->super_Preceptron).input.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar5 = 0;
    do {
      (*(this->super_Preceptron)._vptr_Preceptron[2])(pdVar2[uVar5],this);
      pdVar2 = (this->super_Preceptron).input.super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_start;
      dVar6 = pdVar2[uVar5] * extraout_XMM0_Qa * (this->super_Preceptron).error;
      pdVar1 = (this->super_Preceptron).weight.super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_start;
      dVar7 = pdVar1[uVar5] * dVar6;
      (this->super_Preceptron).delta_weight.super__Vector_base<double,_std::allocator<double>_>.
      _M_impl.super__Vector_impl_data._M_start[uVar5] = dVar7;
      pdVar1[uVar5] =
           dVar7 * (this->super_Preceptron).motivation +
           dVar6 * (this->super_Preceptron).learning_step + pdVar1[uVar5];
      (this->super_Preceptron).delta_bias.super__Vector_base<double,_std::allocator<double>_>.
      _M_impl.super__Vector_impl_data._M_start[uVar5] =
           extraout_XMM0_Qa * (this->super_Preceptron).error;
      uVar5 = uVar5 + 1;
    } while (uVar5 < (ulong)((long)(this->super_Preceptron).weight.
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data._M_finish - (long)pdVar1 >> 3));
  }
  if ((this->super_Preceptron).useBias == true) {
    pdVar2 = (this->super_Preceptron).delta_bias.super__Vector_base<double,_std::allocator<double>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pdVar1 = (this->super_Preceptron).delta_bias.super__Vector_base<double,_std::allocator<double>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    lVar3 = (long)pdVar1 - (long)pdVar2 >> 3;
    if (pdVar1 == pdVar2) {
      dVar6 = 0.0;
    }
    else {
      dVar6 = 0.0;
      lVar4 = 0;
      do {
        dVar6 = dVar6 + pdVar2[lVar4];
        lVar4 = lVar4 + 1;
      } while (lVar3 + (ulong)(lVar3 == 0) != lVar4);
    }
    (this->super_Preceptron).bias =
         (dVar6 / (double)lVar3) * (this->super_Preceptron).learning_step +
         (this->super_Preceptron).bias;
  }
  return;
}

Assistant:

void Backward() {
		for (int i = 0; i < weight.size(); i++) {
			double derivation = Derivation(input[i]);
			double internal_weight_error = input[i] * derivation * error;
			delta_weight[i] = weight[i] * internal_weight_error;
			weight[i] += delta_weight[i] * motivation + learning_step * internal_weight_error;
			delta_bias[i] = derivation * error;
		}
		if (useBias) {
			double average_bias_error = 0.0;
			for (int i = 0; i < delta_bias.size(); i++) {
				average_bias_error += delta_bias[i];
			}average_bias_error /= delta_bias.size();
			bias += learning_step * average_bias_error;
		}
	}